

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.c
# Opt level: O0

Expr xor(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
        int argc)

{
  _Bool _Var1;
  Expr EVar2;
  Expr EVar3;
  Expr expr;
  Expr val;
  int local_40;
  int i;
  int cnt;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  anon_union_8_8_707b72ea_for_Expr_1 local_10;
  
  local_40 = 0;
  for (val.field_1.val_atom._4_4_ = 0; (int)val.field_1.val_atom._4_4_ < argc;
      val.field_1.val_atom._4_4_ = val.field_1.val_atom._4_4_ + 1) {
    EVar2._4_4_ = 0;
    EVar2.type = args[(int)val.field_1.val_atom._4_4_].type;
    EVar2.field_1.val_atom = args[(int)val.field_1.val_atom._4_4_].field_1.val_atom;
    EVar2 = exec_eval(exec,callContext,EVar2);
    expr.field_1 = EVar2.field_1;
    expr._4_4_ = 0;
    expr.type = EVar2.type;
    _Var1 = is_true(exec,expr);
    if (_Var1) {
      local_40 = local_40 + 1;
    }
  }
  if (local_40 == 1) {
    exec_local = *(pExecutor *)&exec->t;
    local_10 = (anon_union_8_8_707b72ea_for_Expr_1)(exec->t).field_1.val_atom;
  }
  else {
    exec_local = *(pExecutor *)&exec->nil;
    local_10 = (anon_union_8_8_707b72ea_for_Expr_1)(exec->nil).field_1.val_atom;
  }
  EVar3._0_8_ = (ulong)exec_local & 0xffffffff;
  EVar3.field_1.val_atom = local_10.val_atom;
  return EVar3;
}

Assistant:

BUILTIN_FUNC(xor)
{
    int cnt = 0;
    for (int i = 0; i < argc; i++)
    {
        Expr val = exec_eval(exec, callContext, args[i]);
        if (is_true(exec, val))
            cnt++;
    }
    if (cnt == 1)
        return exec->t;
    else
        return exec->nil;

}